

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O0

void GetPortalTransition(DVector3 *pos,sector_t **sec)

{
  bool bVar1;
  sector_t *psVar2;
  double dVar3;
  TVector2<double> local_68;
  undefined1 local_58 [32];
  undefined1 local_38 [24];
  double testz;
  sector_t **ppsStack_18;
  bool moved;
  sector_t **sec_local;
  DVector3 *pos_local;
  
  testz._7_1_ = 0;
  local_38._16_8_ = pos->Z;
  ppsStack_18 = sec;
  sec_local = (sector_t **)pos;
  while ((bVar1 = sector_t::PortalBlocksMovement(*ppsStack_18,1), ((bVar1 ^ 0xffU) & 1) != 0 &&
         (psVar2 = sec_local[2], dVar3 = sector_t::GetPortalPlaneZ(*ppsStack_18,1),
         dVar3 < (double)psVar2))) {
    sector_t::GetPortalDisplacement((sector_t *)local_38,(int)*ppsStack_18);
    TVector3<double>::operator+=((TVector3<double> *)sec_local,(Vector2 *)local_38);
    TVector2<double>::TVector2((TVector2<double> *)(local_58 + 0x10),(TVector3<double> *)sec_local);
    psVar2 = P_PointInSector((DVector2 *)(local_58 + 0x10));
    *ppsStack_18 = psVar2;
    testz._7_1_ = 1;
  }
  if ((testz._7_1_ & 1) == 0) {
    while ((bVar1 = sector_t::PortalBlocksMovement(*ppsStack_18,0), ((bVar1 ^ 0xffU) & 1) != 0 &&
           (psVar2 = sec_local[2], dVar3 = sector_t::GetPortalPlaneZ(*ppsStack_18,0),
           (double)psVar2 <= dVar3))) {
      sector_t::GetPortalDisplacement((sector_t *)local_58,(int)*ppsStack_18);
      TVector3<double>::operator+=((TVector3<double> *)sec_local,(Vector2 *)local_58);
      TVector2<double>::TVector2(&local_68,(TVector3<double> *)sec_local);
      psVar2 = P_PointInSector(&local_68);
      *ppsStack_18 = psVar2;
    }
  }
  return;
}

Assistant:

static void GetPortalTransition(DVector3 &pos, sector_t *&sec)
{
	bool moved = false;
	double testz = pos.Z;

	while (!sec->PortalBlocksMovement(sector_t::ceiling))
	{
		if (pos.Z > sec->GetPortalPlaneZ(sector_t::ceiling))
		{
			pos += sec->GetPortalDisplacement(sector_t::ceiling);
			sec = P_PointInSector(pos);
			moved = true;
		}
		else break;
	}
	if (!moved)
	{
		while (!sec->PortalBlocksMovement(sector_t::floor))
		{
			if (pos.Z <= sec->GetPortalPlaneZ(sector_t::floor))
			{
				pos += sec->GetPortalDisplacement(sector_t::floor);
				sec = P_PointInSector(pos);
			}
			else break;
		}
	}
}